

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexRecover(Wal *pWal)

{
  uint uVar1;
  int iVar2;
  u32 uVar3;
  u32 uVar4;
  uint uVar5;
  WalCkptInfo *pWVar6;
  int local_cc;
  int i;
  WalCkptInfo *pInfo;
  u32 nTruncate;
  u32 pgno;
  i64 iOffset;
  uint local_a8;
  u32 nHdr32;
  u32 nHdr;
  u32 iFirst;
  u32 iLast;
  u32 iFrame;
  u32 *aShare;
  u32 iLastFrame;
  u32 iPg;
  int isValid;
  u32 version;
  u32 magic;
  int szPage;
  u8 *aData;
  u8 *puStack_68;
  int szFrame;
  u8 *aFrame;
  u32 *aPrivate;
  u8 aBuf [32];
  u32 local_30;
  int iLock;
  u32 aFrameCksum [2];
  i64 nSize;
  int rc;
  Wal *pWal_local;
  
  memset(&local_30,0,8);
  aBuf._28_4_ = pWal->ckptLock + 1;
  iVar2 = walLockExclusive(pWal,aBuf._28_4_,3 - aBuf._28_4_);
  if (iVar2 != 0) {
    return iVar2;
  }
  memset(&pWal->hdr,0,0x30);
  nSize._4_4_ = sqlite3OsFileSize(pWal->pWalFd,(i64 *)aFrameCksum);
  if (nSize._4_4_ == 0) {
    if (0x20 < (long)aFrameCksum) {
      aFrame = (u8 *)0x0;
      puStack_68 = (u8 *)0x0;
      nSize._4_4_ = sqlite3OsRead(pWal->pWalFd,&aPrivate,0x20,0);
      if (nSize._4_4_ != 0) goto LAB_001d6b6d;
      isValid = sqlite3Get4byte((u8 *)&aPrivate);
      version = sqlite3Get4byte(aBuf);
      if (((((isValid & 0xfffffffeU) == 0x377f0682) && ((version & version - 1) == 0)) &&
          ((int)version < 0x10001)) && (0x1ff < (int)version)) {
        (pWal->hdr).bigEndCksum = (byte)isValid & 1;
        pWal->szPage = version;
        uVar3 = sqlite3Get4byte(aBuf + 4);
        pWal->nCkpt = uVar3;
        *(undefined8 *)(pWal->hdr).aSalt = aBuf._8_8_;
        walChecksumBytes((uint)((pWal->hdr).bigEndCksum == '\0'),(u8 *)&aPrivate,0x18,(u32 *)0x0,
                         (pWal->hdr).aFrameCksum);
        uVar3 = (pWal->hdr).aFrameCksum[0];
        uVar4 = sqlite3Get4byte(aBuf + 0x10);
        if ((uVar3 == uVar4) &&
           (uVar3 = (pWal->hdr).aFrameCksum[1], uVar4 = sqlite3Get4byte(aBuf + 0x14), uVar3 == uVar4
           )) {
          iPg = sqlite3Get4byte((u8 *)((long)&aPrivate + 4));
          if (iPg == 0x2de218) {
            aData._4_4_ = version + 0x18;
            puStack_68 = (u8 *)sqlite3_malloc64((long)aData._4_4_ + 0x8000);
            if (puStack_68 == (u8 *)0x0) {
              nSize._4_4_ = 7;
              goto LAB_001d6b6d;
            }
            _magic = puStack_68 + 0x18;
            aFrame = _magic + (int)version;
            aShare._0_4_ = (u32)(((long)aFrameCksum + -0x20) / (long)aData._4_4_);
            for (aShare._4_4_ = 0; uVar1 = aShare._4_4_, uVar5 = walFramePage((u32)aShare),
                uVar1 <= uVar5; aShare._4_4_ = aShare._4_4_ + 1) {
              nHdr = (u32)aShare;
              if ((ulong)(aShare._4_4_ << 0xc) + 0xfde <= (ulong)(u32)aShare) {
                nHdr = aShare._4_4_ * 0x1000 + 0xfde;
              }
              if (aShare._4_4_ == 0) {
                iVar2 = 0;
              }
              else {
                iVar2 = (aShare._4_4_ - 1) * 0x1000 + 0xfde;
              }
              nHdr32 = iVar2 + 1;
              nSize._4_4_ = walIndexPage(pWal,aShare._4_4_,(u32 **)&iLast);
              if (_iLast == (u32 *)0x0) break;
              pWal->apWiData[aShare._4_4_] = (u32 *)aFrame;
              for (iFirst = nHdr32; iFirst <= nHdr; iFirst = iFirst + 1) {
                _nTruncate = (ulong)(iFirst - 1) * (long)(int)(version + 0x18) + 0x20;
                nSize._4_4_ = sqlite3OsRead(pWal->pWalFd,puStack_68,aData._4_4_,_nTruncate);
                if (((nSize._4_4_ != 0) ||
                    (iLastFrame = walDecodeFrame(pWal,(u32 *)((long)&pInfo + 4),(u32 *)&pInfo,_magic
                                                 ,puStack_68), iLastFrame == 0)) ||
                   (nSize._4_4_ = walIndexAppend(pWal,iFirst,pInfo._4_4_), nSize._4_4_ != 0)) break;
                if ((u32)pInfo != 0) {
                  (pWal->hdr).mxFrame = iFirst;
                  (pWal->hdr).nPage = (u32)pInfo;
                  (pWal->hdr).szPage = (ushort)version & 0xff00 | (ushort)(version >> 0x10);
                  local_30 = (pWal->hdr).aFrameCksum[0];
                  iLock = (pWal->hdr).aFrameCksum[1];
                }
              }
              pWal->apWiData[aShare._4_4_] = _iLast;
              local_a8 = 0;
              if (aShare._4_4_ == 0) {
                local_a8 = 0x88;
              }
              iOffset._4_4_ = local_a8 >> 2;
              memcpy(_iLast + iOffset._4_4_,aFrame + (ulong)iOffset._4_4_ * 4,
                     0x8000 - (ulong)local_a8);
              if (iFirst <= nHdr) break;
            }
            sqlite3_free(puStack_68);
          }
          else {
            nSize._4_4_ = sqlite3CantopenError(0xfaaf);
          }
        }
      }
    }
    if (nSize._4_4_ == 0) {
      (pWal->hdr).aFrameCksum[0] = local_30;
      (pWal->hdr).aFrameCksum[1] = iLock;
      walIndexWriteHdr(pWal);
      pWVar6 = walCkptInfo(pWal);
      pWVar6->nBackfill = 0;
      pWVar6->nBackfillAttempted = (pWal->hdr).mxFrame;
      pWVar6->aReadMark[0] = 0;
      for (local_cc = 1; local_cc < 5; local_cc = local_cc + 1) {
        nSize._4_4_ = walLockExclusive(pWal,local_cc + 3,1);
        if (nSize._4_4_ == 0) {
          if ((local_cc == 1) && ((pWal->hdr).mxFrame != 0)) {
            pWVar6->aReadMark[1] = (pWal->hdr).mxFrame;
          }
          else {
            pWVar6->aReadMark[local_cc] = 0xffffffff;
          }
          walUnlockExclusive(pWal,local_cc + 3,1);
        }
        else if (nSize._4_4_ != 5) goto LAB_001d6b6d;
      }
      if ((pWal->hdr).nPage != 0) {
        sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                    pWal->zWalName);
      }
    }
  }
LAB_001d6b6d:
  walUnlockExclusive(pWal,aBuf._28_4_,3 - aBuf._28_4_);
  return nSize._4_4_;
}

Assistant:

static int walIndexRecover(Wal *pWal){
  int rc;                         /* Return Code */
  i64 nSize;                      /* Size of log file */
  u32 aFrameCksum[2] = {0, 0};
  int iLock;                      /* Lock offset to lock for checkpoint */

  /* Obtain an exclusive lock on all byte in the locking range not already
  ** locked by the caller. The caller is guaranteed to have locked the
  ** WAL_WRITE_LOCK byte, and may have also locked the WAL_CKPT_LOCK byte.
  ** If successful, the same bytes that are locked here are unlocked before
  ** this function returns.
  */
  assert( pWal->ckptLock==1 || pWal->ckptLock==0 );
  assert( WAL_ALL_BUT_WRITE==WAL_WRITE_LOCK+1 );
  assert( WAL_CKPT_LOCK==WAL_ALL_BUT_WRITE );
  assert( pWal->writeLock );
  iLock = WAL_ALL_BUT_WRITE + pWal->ckptLock;
  rc = walLockExclusive(pWal, iLock, WAL_READ_LOCK(0)-iLock);
  if( rc ){
    return rc;
  }

  WALTRACE(("WAL%p: recovery begin...\n", pWal));

  memset(&pWal->hdr, 0, sizeof(WalIndexHdr));

  rc = sqlite3OsFileSize(pWal->pWalFd, &nSize);
  if( rc!=SQLITE_OK ){
    goto recovery_error;
  }

  if( nSize>WAL_HDRSIZE ){
    u8 aBuf[WAL_HDRSIZE];         /* Buffer to load WAL header into */
    u32 *aPrivate = 0;            /* Heap copy of *-shm hash being populated */
    u8 *aFrame = 0;               /* Malloc'd buffer to load entire frame */
    int szFrame;                  /* Number of bytes in buffer aFrame[] */
    u8 *aData;                    /* Pointer to data part of aFrame buffer */
    int szPage;                   /* Page size according to the log */
    u32 magic;                    /* Magic value read from WAL header */
    u32 version;                  /* Magic value read from WAL header */
    int isValid;                  /* True if this frame is valid */
    u32 iPg;                      /* Current 32KB wal-index page */
    u32 iLastFrame;               /* Last frame in wal, based on nSize alone */

    /* Read in the WAL header. */
    rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
    if( rc!=SQLITE_OK ){
      goto recovery_error;
    }

    /* If the database page size is not a power of two, or is greater than
    ** SQLITE_MAX_PAGE_SIZE, conclude that the WAL file contains no valid
    ** data. Similarly, if the 'magic' value is invalid, ignore the whole
    ** WAL file.
    */
    magic = sqlite3Get4byte(&aBuf[0]);
    szPage = sqlite3Get4byte(&aBuf[8]);
    if( (magic&0xFFFFFFFE)!=WAL_MAGIC
     || szPage&(szPage-1)
     || szPage>SQLITE_MAX_PAGE_SIZE
     || szPage<512
    ){
      goto finished;
    }
    pWal->hdr.bigEndCksum = (u8)(magic&0x00000001);
    pWal->szPage = szPage;
    pWal->nCkpt = sqlite3Get4byte(&aBuf[12]);
    memcpy(&pWal->hdr.aSalt, &aBuf[16], 8);

    /* Verify that the WAL header checksum is correct */
    walChecksumBytes(pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN,
        aBuf, WAL_HDRSIZE-2*4, 0, pWal->hdr.aFrameCksum
    );
    if( pWal->hdr.aFrameCksum[0]!=sqlite3Get4byte(&aBuf[24])
     || pWal->hdr.aFrameCksum[1]!=sqlite3Get4byte(&aBuf[28])
    ){
      goto finished;
    }

    /* Verify that the version number on the WAL format is one that
    ** are able to understand */
    version = sqlite3Get4byte(&aBuf[4]);
    if( version!=WAL_MAX_VERSION ){
      rc = SQLITE_CANTOPEN_BKPT;
      goto finished;
    }

    /* Malloc a buffer to read frames into. */
    szFrame = szPage + WAL_FRAME_HDRSIZE;
    aFrame = (u8 *)sqlite3_malloc64(szFrame + WALINDEX_PGSZ);
    if( !aFrame ){
      rc = SQLITE_NOMEM_BKPT;
      goto recovery_error;
    }
    aData = &aFrame[WAL_FRAME_HDRSIZE];
    aPrivate = (u32*)&aData[szPage];

    /* Read all frames from the log file. */
    iLastFrame = (nSize - WAL_HDRSIZE) / szFrame;
    for(iPg=0; iPg<=(u32)walFramePage(iLastFrame); iPg++){
      u32 *aShare;
      u32 iFrame;                 /* Index of last frame read */
      u32 iLast = MIN(iLastFrame, HASHTABLE_NPAGE_ONE+iPg*HASHTABLE_NPAGE);
      u32 iFirst = 1 + (iPg==0?0:HASHTABLE_NPAGE_ONE+(iPg-1)*HASHTABLE_NPAGE);
      u32 nHdr, nHdr32;
      rc = walIndexPage(pWal, iPg, (volatile u32**)&aShare);
      assert( aShare!=0 || rc!=SQLITE_OK );
      if( aShare==0 ) break;
      pWal->apWiData[iPg] = aPrivate;

      for(iFrame=iFirst; iFrame<=iLast; iFrame++){
        i64 iOffset = walFrameOffset(iFrame, szPage);
        u32 pgno;                 /* Database page number for frame */
        u32 nTruncate;            /* dbsize field from frame header */

        /* Read and decode the next log frame. */
        rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
        if( rc!=SQLITE_OK ) break;
        isValid = walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame);
        if( !isValid ) break;
        rc = walIndexAppend(pWal, iFrame, pgno);
        if( NEVER(rc!=SQLITE_OK) ) break;

        /* If nTruncate is non-zero, this is a commit record. */
        if( nTruncate ){
          pWal->hdr.mxFrame = iFrame;
          pWal->hdr.nPage = nTruncate;
          pWal->hdr.szPage = (u16)((szPage&0xff00) | (szPage>>16));
          testcase( szPage<=32768 );
          testcase( szPage>=65536 );
          aFrameCksum[0] = pWal->hdr.aFrameCksum[0];
          aFrameCksum[1] = pWal->hdr.aFrameCksum[1];
        }
      }
      pWal->apWiData[iPg] = aShare;
      nHdr = (iPg==0 ? WALINDEX_HDR_SIZE : 0);
      nHdr32 = nHdr / sizeof(u32);
#ifndef SQLITE_SAFER_WALINDEX_RECOVERY
      /* Memcpy() should work fine here, on all reasonable implementations.
      ** Technically, memcpy() might change the destination to some
      ** intermediate value before setting to the final value, and that might
      ** cause a concurrent reader to malfunction.  Memcpy() is allowed to
      ** do that, according to the spec, but no memcpy() implementation that
      ** we know of actually does that, which is why we say that memcpy()
      ** is safe for this.  Memcpy() is certainly a lot faster.
      */
      memcpy(&aShare[nHdr32], &aPrivate[nHdr32], WALINDEX_PGSZ-nHdr);
#else
      /* In the event that some platform is found for which memcpy()
      ** changes the destination to some intermediate value before
      ** setting the final value, this alternative copy routine is
      ** provided.
      */
      {
        int i;
        for(i=nHdr32; i<WALINDEX_PGSZ/sizeof(u32); i++){
          if( aShare[i]!=aPrivate[i] ){
            /* Atomic memory operations are not required here because if
            ** the value needs to be changed, that means it is not being
            ** accessed concurrently. */
            aShare[i] = aPrivate[i];
          }
        }
      }
#endif
      if( iFrame<=iLast ) break;
    }

    sqlite3_free(aFrame);
  }

finished:
  if( rc==SQLITE_OK ){
    volatile WalCkptInfo *pInfo;
    int i;
    pWal->hdr.aFrameCksum[0] = aFrameCksum[0];
    pWal->hdr.aFrameCksum[1] = aFrameCksum[1];
    walIndexWriteHdr(pWal);

    /* Reset the checkpoint-header. This is safe because this thread is
    ** currently holding locks that exclude all other writers and
    ** checkpointers. Then set the values of read-mark slots 1 through N.
    */
    pInfo = walCkptInfo(pWal);
    pInfo->nBackfill = 0;
    pInfo->nBackfillAttempted = pWal->hdr.mxFrame;
    pInfo->aReadMark[0] = 0;
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        if( i==1 && pWal->hdr.mxFrame ){
          pInfo->aReadMark[i] = pWal->hdr.mxFrame;
        }else{
          pInfo->aReadMark[i] = READMARK_NOT_USED;
        }
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
      }else if( rc!=SQLITE_BUSY ){
        goto recovery_error;
      }
    }

    /* If more than one frame was recovered from the log file, report an
    ** event via sqlite3_log(). This is to help with identifying performance
    ** problems caused by applications routinely shutting down without
    ** checkpointing the log file.
    */
    if( pWal->hdr.nPage ){
      sqlite3_log(SQLITE_NOTICE_RECOVER_WAL,
          "recovered %d frames from WAL file %s",
          pWal->hdr.mxFrame, pWal->zWalName
      );
    }
  }

recovery_error:
  WALTRACE(("WAL%p: recovery %s\n", pWal, rc ? "failed" : "ok"));
  walUnlockExclusive(pWal, iLock, WAL_READ_LOCK(0)-iLock);
  return rc;
}